

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double benchmark_processing<eumorphic::ordered_collection<container,A,B,C,D,CA,CB>>
                 (size_t num_elems)

{
  uint uVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  time_point start;
  uniform_int_distribution<int> rnd_type;
  ordered_collection<container,_A,_B,_C,_D,_CA,_CB> container;
  random_device rd;
  mt19937_64 gen;
  time_point local_1e28;
  param_type local_1e20;
  uniform_real_distribution<double> local_1e18;
  ordered_collection<container,_A,_B,_C,_D,_CA,_CB> local_1e08;
  random_device local_1d58;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9d0;
  
  memset(&local_1e08,0,0xb0);
  std::random_device::random_device(&local_1d58);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&local_9d0,(ulong)uVar1);
  local_1e20._M_a = 0;
  local_1e20._M_b = 5;
  local_1e18._M_param._M_a = 0.0;
  local_1e18._M_param._M_b = 100000.0;
  random_fill<eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
            (&local_1e08,&local_9d0,(uniform_int_distribution<int> *)&local_1e20,&local_1e18,
             num_elems);
  local_1e28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  process<container,_A,_B,_C,_D,_CA,_CB>
            (&local_1e08.super_collection<container,_A,_B,_C,_D,_CA,_CB>);
  dVar3 = toc(&local_1e28);
  sVar2 = eumorphic::collection<container,_A,_B,_C,_D,_CA,_CB>::size
                    (&local_1e08.super_collection<container,_A,_B,_C,_D,_CA,_CB>);
  do_not_optimize_out<container,_A,_B,_C,_D,_CA,_CB>
            (&local_1e08.super_collection<container,_A,_B,_C,_D,_CA,_CB>);
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  std::random_device::~random_device(&local_1d58);
  eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::~ordered_collection(&local_1e08);
  return dVar3 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
}

Assistant:

double benchmark_processing( std::size_t num_elems)
{
	Cont container;

        //std::cout << "p";
        std::random_device rd;
        std::mt19937_64					gen(rd());
	std::uniform_int_distribution<>			rnd_type(0, 5 );
	std::uniform_real_distribution<double>	rnd_value(0, 100000);
	random_fill(container, gen, rnd_type, rnd_value, num_elems);

	auto start = tic();
	{
		process(container);
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}